

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void EthBasePort::PrintDebugData(ostream *debugStream,quadlet_t *data,double clockPeriod)

{
  ushort uVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  uint node_id;
  allocator<char> local_49;
  string local_48;
  quadlet_t *local_28;
  DebugData *p;
  double clockPeriod_local;
  quadlet_t *data_local;
  ostream *debugStream_local;
  
  local_28 = data;
  p = (DebugData *)clockPeriod;
  clockPeriod_local = (double)data;
  data_local = (quadlet_t *)debugStream;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"PrintDebugData",&local_49)
  ;
  bVar2 = CheckDebugHeader(debugStream,&local_48,(char *)local_28,2);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    poVar3 = std::operator<<((ostream *)data_local,"Timestamp: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,local_28[1]);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::dec);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    if ((local_28[2] & 0x80000000) != 0) {
      std::operator<<((ostream *)data_local,"wrReq ");
    }
    if ((local_28[2] & 0x20000000) != 0) {
      std::operator<<((ostream *)data_local,"bw_active ");
    }
    if ((local_28[2] & 0x10000000) != 0) {
      std::operator<<((ostream *)data_local,"eth_send_idle ");
    }
    if ((local_28[2] & 0x8000000) != 0) {
      std::operator<<((ostream *)data_local,"eth_recv_idle ");
    }
    if ((local_28[2] & 0x4000000) != 0) {
      std::operator<<((ostream *)data_local,"UDPError ");
    }
    if ((local_28[2] & 0x1000000) != 0) {
      std::operator<<((ostream *)data_local,"IPV4Error ");
    }
    if ((local_28[2] & 0x800000) != 0) {
      std::operator<<((ostream *)data_local,"sendBusy ");
    }
    if ((local_28[2] & 0x400000) != 0) {
      std::operator<<((ostream *)data_local,"sendRequest ");
    }
    if ((local_28[2] & 0x200000) != 0) {
      std::operator<<((ostream *)data_local,"eth_send_fw_ack ");
    }
    if ((local_28[2] & 0x100000) != 0) {
      std::operator<<((ostream *)data_local,"eth_send_fw_req ");
    }
    std::ostream::operator<<(data_local,std::endl<char,std::char_traits<char>>);
    if ((local_28[2] & 0x80000) != 0) {
      std::operator<<((ostream *)data_local,"recvBusy ");
    }
    if ((local_28[2] & 0x40000) != 0) {
      std::operator<<((ostream *)data_local,"recvRequest ");
    }
    if ((local_28[2] & 0x20000) != 0) {
      std::operator<<((ostream *)data_local,"isLocal ");
    }
    if ((local_28[2] & 0x10000) != 0) {
      std::operator<<((ostream *)data_local,"isRemote ");
    }
    if ((local_28[2] & 0x8000) != 0) {
      std::operator<<((ostream *)data_local,"fwPacketFresh ");
    }
    if ((local_28[2] & 0x4000) != 0) {
      std::operator<<((ostream *)data_local,"isForward ");
    }
    if ((local_28[2] & 0x2000) != 0) {
      std::operator<<((ostream *)data_local,"sendARP ");
    }
    if ((local_28[2] & 0x1000) != 0) {
      std::operator<<((ostream *)data_local,"isUDP ");
    }
    if ((local_28[2] & 0x800) != 0) {
      std::operator<<((ostream *)data_local,"isICMP  ");
    }
    if ((local_28[2] & 0x400) != 0) {
      std::operator<<((ostream *)data_local,"isEcho ");
    }
    if ((local_28[2] & 0x200) != 0) {
      std::operator<<((ostream *)data_local,"ipv4_long ");
    }
    if ((local_28[2] & 0x100) != 0) {
      std::operator<<((ostream *)data_local,"ipv4_short ");
    }
    if ((local_28[2] & 0x80) != 0) {
      std::operator<<((ostream *)data_local,"fw_bus_reset ");
    }
    if ((local_28[2] & 0x40) != 0) {
      std::operator<<((ostream *)data_local,"ipWrite ");
    }
    if ((local_28[2] & 0x20) != 0) {
      std::operator<<((ostream *)data_local,"hubSend ");
    }
    if ((local_28[2] & 0x10) != 0) {
      std::operator<<((ostream *)data_local,"bcResp ");
    }
    std::ostream::operator<<(data_local,std::endl<char,std::char_traits<char>>);
    uVar1 = *(ushort *)((long)local_28 + 0xe);
    poVar3 = std::operator<<((ostream *)data_local,"FireWire node_id: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(int)(uVar1 & 0xfc00) >> 10);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"LengthFW: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ushort)local_28[3]);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"MaxCountFW: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,*(ushort *)((long)local_28 + 0xe) & 0x3ff);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"FwCtrl: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,*(ushort *)((long)local_28 + 0x12));
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"Host FW Addr: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::hex);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ushort)local_28[4]);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"Fw Bus Generation: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,(ushort)*(byte *)((long)local_28 + 0x1d));
    std::ostream::operator<<(data_local,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"sendState: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    poVar3 = (ostream *)
             std::ostream::operator<<(pvVar4,(int)(uint)*(ushort *)((long)local_28 + 0x16) >> 0xc);
    poVar3 = std::operator<<(poVar3,", recvState: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)((ushort)local_28[5] & 0x7000) >> 0xc);
    poVar3 = std::operator<<(poVar3,", nextRecv: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)((ushort)local_28[5] & 0x700) >> 8);
    poVar3 = std::operator<<(poVar3,", recvCnt: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(ushort)local_28[5] & 0x3f);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"numIPv4: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ushort)local_28[6]);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"numUDP: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,*(ushort *)((long)local_28 + 0x1a));
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"numARP: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ushort)(byte)local_28[7]);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"numICMP: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ushort)*(byte *)((long)local_28 + 0x1e));
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"numMulticastWrite: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ushort)*(byte *)((long)local_28 + 0x2a));
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"br_wait: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ushort)*(byte *)((long)local_28 + 0x1f));
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"numPacketError: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,(ushort)(byte)local_28[8]);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"bwState: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    std::ostream::operator<<(pvVar4,*(byte *)((long)local_28 + 0x21) & 7);
    if ((*(byte *)((long)local_28 + 0x21) & 0x80) != 0) {
      std::operator<<((ostream *)data_local,", bw_err");
    }
    poVar3 = (ostream *)std::ostream::operator<<(data_local,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"bw_left: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::dec);
    pvVar4 = (void *)std::ostream::operator<<(pvVar4,*(ushort *)((long)local_28 + 0x22));
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)data_local,"fw_left: ");
    std::ostream::operator<<(poVar3,*(ushort *)((long)local_28 + 0x26));
    if ((*(byte *)((long)local_28 + 0x25) & 0x80) != 0) {
      std::operator<<((ostream *)data_local,", fw_err");
    }
    poVar3 = std::operator<<((ostream *)data_local,", fw_wait_cnt: ");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,(ushort)(byte)local_28[9]);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    if ((short)local_28[10] != 0) {
      poVar3 = std::operator<<((ostream *)data_local,"Unsupported UDP port: ");
      pvVar4 = (void *)std::ostream::operator<<(poVar3,(ushort)local_28[10]);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void EthBasePort::PrintDebugData(std::ostream &debugStream, const quadlet_t *data, double clockPeriod)
{
    // Following structure must match DebugData in EthernetIO.v
    struct DebugData {
        char     header[4];        // Quad 0
        uint32_t timestampBegin;   // Quad 1
        uint32_t statusbits;       // Quad 2
        uint16_t LengthFW;         // Quad 3
        uint16_t quad3_high;
        uint16_t Host_FW_Addr;     // Quad 4
        uint16_t FwCtrl;
        uint16_t quad5_low;        // Quad 5
        uint16_t quad5_high;
        uint16_t numIPv4;          // Quad 6
        uint16_t numUDP;
        uint8_t  numARP;           // Quad 7
        uint8_t  fw_bus_gen;
        uint8_t  numICMP;
        uint8_t  br_wait_cnt;
        uint8_t  numPacketError;   // Quad 8
        uint8_t  bwState;
        uint16_t bw_left;
        uint8_t  fw_wait_cnt;      // Quad 9
        uint8_t  fwState;
        uint16_t fw_left;
        uint16_t port_unknown;     // Quad 10
        uint8_t  numMulticastWrite;
        uint8_t  quad10_high;
        uint32_t unused[5];        // Quads 10-15
    };
    if (sizeof(DebugData) != 16*sizeof(quadlet_t)) {
        debugStream << "PrintDebugData: structure packing problem" << std::endl;
        return;
    }
    const DebugData *p = reinterpret_cast<const DebugData *>(data);
    if (!CheckDebugHeader(debugStream, "PrintDebugData", p->header, 2))
        return;

    debugStream << "Timestamp: " << std::hex << p->timestampBegin << std::dec << std::endl;
    if (p->statusbits & 0x80000000) debugStream << "wrReq ";
    if (p->statusbits & 0x20000000) debugStream << "bw_active ";
    if (p->statusbits & 0x10000000) debugStream << "eth_send_idle ";
    if (p->statusbits & 0x08000000) debugStream << "eth_recv_idle ";
    if (p->statusbits & 0x04000000) debugStream << "UDPError ";
    if (p->statusbits & 0x01000000) debugStream << "IPV4Error ";
    if (p->statusbits & 0x00800000) debugStream << "sendBusy ";
    if (p->statusbits & 0x00400000) debugStream << "sendRequest ";
    if (p->statusbits & 0x00200000) debugStream << "eth_send_fw_ack ";
    if (p->statusbits & 0x00100000) debugStream << "eth_send_fw_req ";
    debugStream << std::endl;
    if (p->statusbits & 0x00080000) debugStream << "recvBusy ";
    if (p->statusbits & 0x00040000) debugStream << "recvRequest ";
    if (p->statusbits & 0x00020000) debugStream << "isLocal ";
    if (p->statusbits & 0x00010000) debugStream << "isRemote ";
    if (p->statusbits & 0x00008000) debugStream << "fwPacketFresh ";
    if (p->statusbits & 0x00004000) debugStream << "isForward ";
    if (p->statusbits & 0x00002000) debugStream << "sendARP ";
    if (p->statusbits & 0x00001000) debugStream << "isUDP ";
    if (p->statusbits & 0x00000800) debugStream << "isICMP  ";
    if (p->statusbits & 0x00000400) debugStream << "isEcho ";
    if (p->statusbits & 0x00000200) debugStream << "ipv4_long ";
    if (p->statusbits & 0x00000100) debugStream << "ipv4_short ";
    if (p->statusbits & 0x00000080) debugStream << "fw_bus_reset ";
    if (p->statusbits & 0x00000040) debugStream << "ipWrite ";
    if (p->statusbits & 0x00000020) debugStream << "hubSend ";
    if (p->statusbits & 0x00000010) debugStream << "bcResp ";
    debugStream << std::endl;
    unsigned int node_id = (p->quad3_high&0xfc00) >> 10;    // node_is is upper 6 bits
    debugStream << "FireWire node_id: " << node_id << std::endl;
    debugStream << "LengthFW: " << std::dec << p->LengthFW << std::endl;
    debugStream << "MaxCountFW: " << std::dec << (p->quad3_high&0x3ff) << std::endl;
    debugStream << "FwCtrl: " << std::hex << p->FwCtrl << std::endl;
    debugStream << "Host FW Addr: " << std::hex << p->Host_FW_Addr << std::endl;
    debugStream << "Fw Bus Generation: " << std::dec << static_cast<uint16_t>(p->fw_bus_gen);
    debugStream << std::endl;
    debugStream << "sendState: "   << std::dec << (p->quad5_high>>12)
                << ", recvState: " << ((p->quad5_low&0x7000)>>12)
                << ", nextRecv: "  << ((p->quad5_low&0x0700)>>8)
                << ", recvCnt: " << (p->quad5_low&0x003f) << std::endl;
    debugStream << "numIPv4: " << std::dec << p->numIPv4 << std::endl;
    debugStream << "numUDP: " << std::dec << p->numUDP << std::endl;
    debugStream << "numARP: " << std::dec << static_cast<uint16_t>(p->numARP) << std::endl;
    debugStream << "numICMP: " << std::dec << static_cast<uint16_t>(p->numICMP) << std::endl;
    debugStream << "numMulticastWrite: " << std::dec << static_cast<uint16_t>(p->numMulticastWrite) << std::endl;
    debugStream << "br_wait: " << std::dec << static_cast<uint16_t>(p->br_wait_cnt) << std::endl;
    debugStream << "numPacketError: " << std::dec << static_cast<uint16_t>(p->numPacketError) << std::endl;
    debugStream << "bwState: " << std::dec << static_cast<uint16_t>(p->bwState & 0x07);
    if (p->bwState & 0x80) debugStream << ", bw_err";
    debugStream << std::endl << "bw_left: " << std::dec << p->bw_left << std::endl;
    debugStream << "fw_left: " << p->fw_left;
    if (p->fwState & 0x80) debugStream << ", fw_err";
    debugStream << ", fw_wait_cnt: " << static_cast<uint16_t>(p->fw_wait_cnt) << std::endl;
    if (p->port_unknown)
        debugStream << "Unsupported UDP port: " << p->port_unknown << std::endl;
}